

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

void SetLogStreams(ImportData *imp)

{
  uint uVar1;
  uint defStreams;
  
  puts("\nAttaching log stream   ...           OK");
  uVar1 = (uint)((imp->logFile)._M_string_length != 0);
  defStreams = uVar1 + 4;
  if (imp->showLog == false) {
    defStreams = uVar1;
  }
  Assimp::DefaultLogger::create
            ((imp->logFile)._M_dataplus._M_p,(uint)imp->verbose,defStreams,(IOSystem *)0x0);
  return;
}

Assistant:

void SetLogStreams(const ImportData& imp)
{
	printf("\nAttaching log stream   ...           OK\n");
		
	unsigned int flags = 0;
	if (imp.logFile.length()) {
		flags |= aiDefaultLogStream_FILE;
	}
	if (imp.showLog) {
		flags |= aiDefaultLogStream_STDERR;
	}
	DefaultLogger::create(imp.logFile.c_str(),imp.verbose ? Logger::VERBOSE : Logger::NORMAL,flags);
}